

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

double ipx::PrimalResidual(Model *model,Vector *x)

{
  Int i;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = 0.0;
  for (lVar1 = 0; lVar1 < (int)(model->b_)._M_size; lVar1 = lVar1 + 1) {
    dVar4 = (model->b_)._M_data[lVar1];
    dVar3 = DotColumn(&model->AIt_,(Int)lVar1,x);
    dVar4 = ABS(dVar4 - dVar3);
    if (dVar4 <= dVar2) {
      dVar4 = dVar2;
    }
    dVar2 = dVar4;
  }
  return dVar2;
}

Assistant:

double PrimalResidual(const Model& model, const Vector& x) {
    const SparseMatrix& AIt = model.AIt();
    const Vector& b = model.b();
    assert((Int)x.size() == AIt.rows());

    double res = 0.0;
    for (Int i = 0; i < (Int)b.size(); i++) {
        double r = b[i] - DotColumn(AIt, i, x);
        res = std::max(res, std::abs(r));
    }
    return res;
}